

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_LdHomeObjProto(Var homeObj,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  ThreadContext *threadContext;
  JavascriptLibrary *pJVar4;
  RecyclableObject *this;
  undefined4 *puVar5;
  RecyclableObject *superBase;
  TypeId typeId;
  RecyclableObject *thisObjPrototype;
  undefined1 local_40 [8];
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var homeObj_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  if ((homeObj == (Var)0x0) || (bVar2 = VarIs<Js::RecyclableObject>(homeObj), !bVar2)) {
    pJVar4 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
    homeObj_local = JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
  }
  else {
    this = VarTo<Js::RecyclableObject>(homeObj);
    TVar3 = RecyclableObject::GetTypeId(this);
    if ((TVar3 == TypeIds_Null) || (TVar3 == TypeIds_Undefined)) {
      JavascriptError::ThrowReferenceError
                ((ScriptContext *)reentrancylock._24_8_,-0x7ff5ebe7,(PCWSTR)0x0);
    }
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x27d9,"(thisObjPrototype != nullptr)",
                                  "thisObjPrototype != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    homeObj_local = RecyclableObject::GetPrototype(this);
    if (((RecyclableObject *)homeObj_local == (RecyclableObject *)0x0) ||
       (bVar2 = VarIsCorrectType<Js::RecyclableObject>((RecyclableObject *)homeObj_local), !bVar2))
    {
      pJVar4 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
      homeObj_local = JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return homeObj_local;
}

Assistant:

Var JavascriptOperators::OP_LdHomeObjProto(Var homeObj, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(LdHomeObjProto, reentrancylock, scriptContext->GetThreadContext());
        if (homeObj == nullptr || !VarIs<RecyclableObject>(homeObj))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        RecyclableObject *thisObjPrototype = VarTo<RecyclableObject>(homeObj);

        TypeId typeId = thisObjPrototype->GetTypeId();

        if (typeId == TypeIds_Null || typeId == TypeIds_Undefined)
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_BadSuperReference);
        }

        Assert(thisObjPrototype != nullptr);

        RecyclableObject *superBase = thisObjPrototype->GetPrototype();

        if (superBase == nullptr || !VarIsCorrectType(superBase))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return superBase;
        JIT_HELPER_END(LdHomeObjProto);
    }